

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void fscope_end(FuncState *fs)

{
  byte bVar1;
  LexState *ls;
  FuncScope *bl;
  FuncState *pFVar2;
  VarInfo *pVVar3;
  byte bVar4;
  MSize idx;
  ulong uVar5;
  
  ls = fs->ls;
  bl = fs->bl;
  fs->bl = bl->prev;
  bVar1 = bl->nactvar;
  pFVar2 = ls->fs;
  uVar5 = (ulong)pFVar2->nactvar;
  while (bVar1 < uVar5) {
    pVVar3 = ls->vstack;
    uVar5 = uVar5 - 1;
    pFVar2->nactvar = (BCReg)uVar5;
    pVVar3[pFVar2->varmap[uVar5 & 0xffffffff]].endpc = pFVar2->pc;
  }
  fs->freereg = fs->nactvar;
  bVar4 = bl->flags;
  if ((bVar4 & 0x18) == 8) {
    bcemit_INS(fs,(uint)bVar1 << 8 | 0x80000032);
    bVar4 = bl->flags;
  }
  if ((bVar4 & 2) != 0) {
    if ((bVar4 & 1) == 0) goto LAB_0012b93e;
    idx = gola_new(ls,(GCstr *)0x1,'\x04',fs->pc);
    ls->vtop = idx;
    gola_resolve(ls,bl,idx);
    bVar4 = bl->flags;
  }
  if ((bVar4 & 4) == 0) {
    return;
  }
LAB_0012b93e:
  gola_fixup(ls,bl);
  return;
}

Assistant:

static void fscope_end(FuncState *fs)
{
  FuncScope *bl = fs->bl;
  LexState *ls = fs->ls;
  fs->bl = bl->prev;
  var_remove(ls, bl->nactvar);
  fs->freereg = fs->nactvar;
  lj_assertFS(bl->nactvar == fs->nactvar, "bad regalloc");
  if ((bl->flags & (FSCOPE_UPVAL|FSCOPE_NOCLOSE)) == FSCOPE_UPVAL)
    bcemit_AJ(fs, BC_UCLO, bl->nactvar, 0);
  if ((bl->flags & FSCOPE_BREAK)) {
    if ((bl->flags & FSCOPE_LOOP)) {
      MSize idx = gola_new(ls, NAME_BREAK, VSTACK_LABEL, fs->pc);
      ls->vtop = idx;  /* Drop break label immediately. */
      gola_resolve(ls, bl, idx);
    } else {  /* Need the fixup step to propagate the breaks. */
      gola_fixup(ls, bl);
      return;
    }
  }
  if ((bl->flags & FSCOPE_GOLA)) {
    gola_fixup(ls, bl);
  }
}